

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlite_kv_fetch(unqlite *pDb,void *pKey,int nKeyLen,void *pBuf,unqlite_int64 *pBufLen)

{
  unqlite_kv_methods *puVar1;
  unqlite_kv_cursor *puVar2;
  unqlite_kv_engine *puVar3;
  undefined1 local_78 [8];
  SyBlob sBlob;
  int rc;
  unqlite_kv_cursor *pCur;
  unqlite_kv_engine *pEngine;
  unqlite_kv_methods *pMethods;
  unqlite_int64 *pBufLen_local;
  void *pBuf_local;
  int nKeyLen_local;
  void *pKey_local;
  unqlite *pDb_local;
  
  if ((pDb == (unqlite *)0x0) || (pDb->nMagic != 0xdb7c2712)) {
    pDb_local._4_4_ = -0x18;
  }
  else {
    puVar3 = unqlitePagerGetKvEngine(pDb);
    puVar1 = puVar3->pIo->pMethods;
    puVar2 = (pDb->sDB).pCursor;
    pBuf_local._4_4_ = nKeyLen;
    if (nKeyLen < 0) {
      pBuf_local._4_4_ = SyStrlen((char *)pKey);
    }
    if (pBuf_local._4_4_ == 0) {
      unqliteGenError(pDb,"Empty key");
      sBlob._28_4_ = 0xfffffffd;
    }
    else {
      sBlob._28_4_ = (*puVar1->xSeek)(puVar2,pKey,pBuf_local._4_4_,1);
    }
    if (sBlob._28_4_ == 0) {
      if (pBuf == (void *)0x0) {
        sBlob._28_4_ = (*puVar1->xDataLength)(puVar2,pBufLen);
      }
      else {
        SyBlobInitFromBuf((SyBlob *)local_78,pBuf,(sxu32)*pBufLen);
        sBlob._28_4_ = (*puVar1->xData)(puVar2,unqliteDataConsumer,local_78);
        *pBufLen = (ulong)(uint)sBlob.pBlob;
        SyBlobRelease((SyBlob *)local_78);
      }
    }
    pDb_local._4_4_ = sBlob._28_4_;
  }
  return pDb_local._4_4_;
}

Assistant:

int unqlite_kv_fetch(unqlite *pDb,const void *pKey,int nKeyLen,void *pBuf,unqlite_int64 *pBufLen)
{
	unqlite_kv_methods *pMethods;
	unqlite_kv_engine *pEngine;
	unqlite_kv_cursor *pCur;
	int rc;
	if( UNQLITE_DB_MISUSE(pDb) ){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 /* Point to the underlying storage engine */
	 pEngine = unqlitePagerGetKvEngine(pDb);
	 pMethods = pEngine->pIo->pMethods;
	 pCur = pDb->sDB.pCursor;
	 if( nKeyLen < 0 ){
		 /* Assume a null terminated string and compute it's length */
		 nKeyLen = SyStrlen((const char *)pKey);
	 }
	 if( !nKeyLen ){
		  unqliteGenError(pDb,"Empty key");
		  rc = UNQLITE_EMPTY;
	 }else{
		  /* Seek to the record position */
		  rc = pMethods->xSeek(pCur,pKey,nKeyLen,UNQLITE_CURSOR_MATCH_EXACT);
	 }
	 if( rc == UNQLITE_OK ){
		 if( pBuf == 0 ){
			 /* Data length only */
			 rc = pMethods->xDataLength(pCur,pBufLen);
		 }else{
			 SyBlob sBlob;
			 /* Initialize the data consumer */
			 SyBlobInitFromBuf(&sBlob,pBuf,(sxu32)*pBufLen);
			 /* Consume the data */
			 rc = pMethods->xData(pCur,unqliteDataConsumer,&sBlob);
			 /* Data length */
			 *pBufLen = (unqlite_int64)SyBlobLength(&sBlob);
			 /* Cleanup */
			 SyBlobRelease(&sBlob);
		 }
	 }
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}